

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTWave_Destroy(FACTWave *pWave)

{
  undefined8 *in_RDI;
  FACTNotification note;
  FAudioMutex mutex;
  undefined1 local_49;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  void *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd4;
  FACTWave *in_stack_ffffffffffffffd8;
  uint32_t local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = 1;
  }
  else {
    FAudio_PlatformLockMutex((FAudioMutex)0x114f05);
    FACTWave_Stop(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    LinkedList_RemoveEntry
              ((LinkedList **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8,
               (FAudioMutex)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (FAudioFreeFunc)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    FAudioVoice_DestroyVoice
              ((FAudioVoice *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (in_RDI[7] != 0) {
      (**(code **)(*(long *)*in_RDI + 0xd0))(in_RDI[7]);
    }
    if ((*(char *)((long)in_RDI + 0x12) != '\0') ||
       ((*(uint *)(*(long *)*in_RDI + 0xe0) & 0x8000) != 0)) {
      local_49 = 0x10;
      (**(code **)(*(long *)*in_RDI + 8))(&local_49);
    }
    (**(code **)(*(long *)*in_RDI + 0xd0))(in_RDI);
    FAudio_PlatformUnlockMutex((FAudioMutex)0x115046);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t FACTWave_Destroy(FACTWave *pWave)
{
	FAudioMutex mutex;
	FACTNotification note;
	if (pWave == NULL)
	{
		return 1;
	}

	FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);

	/* Stop before we start deleting everything */
	FACTWave_Stop(pWave, FACT_FLAG_STOP_IMMEDIATE);

	LinkedList_RemoveEntry(
		&pWave->parentBank->waveList,
		pWave,
		pWave->parentBank->waveLock,
		pWave->parentBank->parentEngine->pFree
	);

	FAudioVoice_DestroyVoice(pWave->voice);
	if (pWave->streamCache != NULL)
	{
		pWave->parentBank->parentEngine->pFree(pWave->streamCache);
	}
	if (pWave->notifyOnDestroy || pWave->parentBank->parentEngine->notifications & NOTIFY_WAVEDESTROY)
	{
		note.type = FACTNOTIFICATIONTYPE_WAVEDESTROYED;
		note.wave.pWave = pWave;
		if (pWave->parentBank->parentEngine->notifications & NOTIFY_WAVEDESTROY)
		{
			note.pvContext = pWave->parentBank->parentEngine->wave_context;
		}
		else
		{
			note.pvContext = pWave->usercontext;
		}
		pWave->parentBank->parentEngine->notificationCallback(&note);
	}

	mutex = pWave->parentBank->parentEngine->apiLock;
	pWave->parentBank->parentEngine->pFree(pWave);
	FAudio_PlatformUnlockMutex(mutex);
	return 0;
}